

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  ptls_cipher_suite_t *ppVar2;
  size_t sVar3;
  int iVar4;
  FILE *fp;
  EVP_PKEY *pkey;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  FILE *__stream;
  char *pcVar8;
  char *__format;
  ptls_key_exchange_context_t **ctx;
  char *pcVar9;
  ptls_cipher_suite_t **pppVar10;
  anon_struct_2056_2_5014a043 *paVar11;
  size_t sStack_10e0;
  uint16_t padded_length;
  undefined1 local_10ce;
  undefined1 local_10cd;
  ushort local_10cc;
  ushort local_10ca;
  ulong local_10c8;
  char **local_10c0;
  uint64_t lifetime;
  ptls_buffer_t local_10b0;
  uint local_1090;
  undefined2 local_108a;
  uint64_t local_1088;
  undefined4 local_107c;
  ulong local_1078;
  ulong local_1070;
  undefined4 local_1068 [10];
  anon_struct_2056_2_5014a043 key_exchanges;
  ptls_cipher_suite_t *local_838 [257];
  
  OPENSSL_init_crypto(2);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  memset(&key_exchanges,0,0x808);
  memset(local_838,0,0x808);
  padded_length = 0x104;
  lifetime = 0x76a700;
  local_10c8 = 0;
LAB_00105a40:
  do {
    paVar11 = &key_exchanges;
    pppVar10 = local_838;
    iVar4 = getopt(argc,argv,"K:c:d:p:h");
    pcVar9 = _optarg;
    if (iVar4 == 0x4b) {
      fp = fopen(_optarg,"rt");
      __stream = _stderr;
      pcVar9 = _optarg;
      if (fp == (FILE *)0x0) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        __format = "failed to open file:%s:%s\n";
      }
      else {
        pkey = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        __stream = _stderr;
        pcVar9 = _optarg;
        if (pkey != (EVP_PKEY *)0x0) {
          fclose(fp);
          ctx = key_exchanges.elements + key_exchanges.count;
          key_exchanges.count = key_exchanges.count + 1;
          iVar4 = ptls_openssl_create_key_exchange(ctx,(EVP_PKEY *)pkey);
          if (iVar4 != 0) {
            pcVar8 = "unknown type of private key found in file:%s\n";
            pcVar9 = _optarg;
LAB_00105f62:
            fprintf(_stderr,pcVar8,pcVar9);
            goto LAB_00105fe3;
          }
          EVP_PKEY_free(pkey);
          goto LAB_00105a40;
        }
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        __format = "failed to read private key from file:%s:%s\n";
      }
      fprintf(__stream,__format,pcVar9,pcVar8);
      goto LAB_00105fe3;
    }
    if (iVar4 == 100) {
      iVar4 = __isoc99_sscanf(_optarg,"%lu",&lifetime);
      if ((iVar4 != 1) || (lifetime == 0)) {
        pcVar9 = "lifetime must be a positive integer\n";
        sStack_10e0 = 0x24;
        goto LAB_00105dc8;
      }
      lifetime = lifetime * 0x15180;
      goto LAB_00105a40;
    }
    if (iVar4 != 0x70) {
      if (iVar4 == -1) {
        if (local_10c8 == 0) {
          local_838[0] = &ptls_openssl_aes128gcmsha256;
        }
        if (key_exchanges.count != 0) {
          local_1090 = (uint)padded_length;
          local_10c8 = time((time_t *)0x0);
          local_1088 = lifetime;
          local_10b0.base = "";
          local_10b0.is_allocated = 0;
          local_10b0.capacity = 0;
          local_10b0.off = 0;
          local_108a = 0x1ff;
          iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_108a,2);
          if (iVar4 != 0) goto LAB_00105dab;
          local_107c = 0;
          iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_107c,4);
          if ((iVar4 != 0) || (iVar4 = ptls_buffer__do_pushv(&local_10b0,"",2), iVar4 != 0))
          goto LAB_00105dab;
          local_10c0 = (char **)local_10b0.off;
          break;
        }
      }
      else {
        local_10c0 = argv;
        if (iVar4 == 99) {
          pppVar10 = ptls_openssl_cipher_suites;
          do {
            ppVar2 = *pppVar10;
            if (ppVar2 == (ptls_cipher_suite_t *)0x0) goto LAB_00105f19;
            iVar4 = strcasecmp(ppVar2->aead->name,pcVar9);
            pppVar10 = pppVar10 + 1;
          } while (iVar4 != 0);
          local_838[local_10c8] = ppVar2;
          local_10c8 = local_10c8 + 1;
          argv = local_10c0;
          goto LAB_00105a40;
        }
        if (iVar4 == 0x68) {
          usage(*argv,0);
          pcVar9 = "K:c:d:p:h";
LAB_00105f19:
          pcVar8 = "unknown cipher-suite: %s\n";
          goto LAB_00105f62;
        }
        usage(*argv,1);
      }
      pcVar9 = "no private key specified\n";
      sStack_10e0 = 0x19;
      goto LAB_00105dc8;
    }
    iVar4 = __isoc99_sscanf(_optarg,"%hu",&padded_length);
    if ((iVar4 != 1) || (padded_length == 0)) goto LAB_00105f2f;
  } while( true );
LAB_00105cb1:
  if (paVar11->elements[0] == (ptls_key_exchange_context_t *)0x0) goto LAB_00105d3d;
  uVar1 = paVar11->elements[0]->algo->id;
  local_10ca = uVar1 << 8 | uVar1 >> 8;
  iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_10ca,2);
  if (((iVar4 != 0) ||
      (iVar4 = ptls_buffer__do_pushv(&local_10b0,"",2), sVar3 = local_10b0.off, iVar4 != 0)) ||
     (iVar4 = ptls_buffer__do_pushv
                        (&local_10b0,(paVar11->elements[0]->pubkey).base,
                         (paVar11->elements[0]->pubkey).len), iVar4 != 0)) goto LAB_00105dab;
  (local_10b0.base + -2)[sVar3] = (uint8_t)(local_10b0.off - sVar3 >> 8);
  (local_10b0.base + -1)[sVar3] = (uint8_t)(local_10b0.off - sVar3);
  paVar11 = (anon_struct_2056_2_5014a043 *)(paVar11->elements + 1);
  goto LAB_00105cb1;
LAB_00105f2f:
  pcVar9 = "padded length must be a positive integer\n";
  sStack_10e0 = 0x29;
  goto LAB_00105dc8;
LAB_00105d3d:
  (local_10b0.base + -2)[(long)local_10c0] = (uint8_t)(local_10b0.off - (long)local_10c0 >> 8);
  (local_10b0.base + -1)[(long)local_10c0] = (uint8_t)(local_10b0.off - (long)local_10c0);
  iVar4 = ptls_buffer__do_pushv(&local_10b0,"",2);
  sVar3 = local_10b0.off;
  if (iVar4 == 0) {
    do {
      if (*pppVar10 == (ptls_cipher_suite_t *)0x0) {
        (local_10b0.base + -2)[sVar3] = (uint8_t)(local_10b0.off - sVar3 >> 8);
        (local_10b0.base + -1)[sVar3] = (uint8_t)(local_10b0.off - sVar3);
        local_10ce = (undefined1)(local_1090 >> 8);
        local_10cd = (undefined1)local_1090;
        iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_10ce,2);
        if (iVar4 == 0) {
          local_1070 = local_10c8 >> 0x38 | (local_10c8 & 0xff000000000000) >> 0x28 |
                       (local_10c8 & 0xff0000000000) >> 0x18 | (local_10c8 & 0xff00000000) >> 8 |
                       (local_10c8 & 0xff000000) << 8 | (local_10c8 & 0xff0000) << 0x18 |
                       (local_10c8 & 0xff00) << 0x28 | local_10c8 << 0x38;
          iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_1070,8);
          if (iVar4 == 0) {
            uVar5 = (local_10c8 + local_1088) - 1;
            local_1078 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                         (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                         (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
            iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_1078,8);
            if ((iVar4 == 0) && (iVar4 = ptls_buffer__do_pushv(&local_10b0,"",2), iVar4 == 0)) {
              for (lVar6 = -2; lVar6 != 0; lVar6 = lVar6 + 1) {
                (local_10b0.base + local_10b0.off)[lVar6] = '\0';
              }
              ptls_calc_hash(&ptls_openssl_sha256,local_1068,local_10b0.base,local_10b0.off);
              *(undefined4 *)(local_10b0.base + 2) = local_1068[0];
              fwrite(local_10b0.base,1,local_10b0.off,_stdout);
              fflush(_stdout);
              ptls_buffer__release_memory(&local_10b0);
              return 0;
            }
          }
        }
        break;
      }
      uVar1 = (*pppVar10)->id;
      local_10cc = uVar1 << 8 | uVar1 >> 8;
      iVar4 = ptls_buffer__do_pushv(&local_10b0,&local_10cc,2);
      pppVar10 = pppVar10 + 1;
    } while (iVar4 == 0);
  }
LAB_00105dab:
  ptls_buffer__release_memory(&local_10b0);
  pcVar9 = "failed to generate ESNI private structure.\n";
  sStack_10e0 = 0x2b;
LAB_00105dc8:
  fwrite(pcVar9,sStack_10e0,1,_stderr);
LAB_00105fe3:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;
    while ((ch = getopt(argc, argv, "K:c:d:p:h")) != -1) {
        switch (ch) {
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}